

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

QMenuBar * __thiscall QMdiSubWindowPrivate::menuBar(QMdiSubWindowPrivate *this)

{
  bool bVar1;
  QWidget *pQVar2;
  QMainWindow *this_00;
  QMenuBar *pQVar3;
  
  pQVar2 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar1 = QWidget::isMaximized(pQVar2);
  if (bVar1) {
    bVar1 = drawTitleBarWhenMaximized(this);
    if (!bVar1) {
      bVar1 = isChildOfTabbedQMdiArea((QMdiSubWindow *)pQVar2);
      if (!bVar1) {
        pQVar2 = QWidget::window(pQVar2);
        this_00 = QtPrivate::qobject_cast_helper<QMainWindow*,QObject>(&pQVar2->super_QObject);
        if (this_00 != (QMainWindow *)0x0) {
          pQVar3 = QMainWindow::menuBar(this_00);
          return pQVar3;
        }
      }
    }
  }
  return (QMenuBar *)0x0;
}

Assistant:

QMenuBar *QMdiSubWindowPrivate::menuBar() const
{
#if !QT_CONFIG(mainwindow)
    return nullptr;
#else
    Q_Q(const QMdiSubWindow);
    if (!q->isMaximized() || drawTitleBarWhenMaximized() || isChildOfTabbedQMdiArea(q))
        return nullptr;

    if (QMainWindow *mainWindow = qobject_cast<QMainWindow *>(q->window()))
        return mainWindow->menuBar();

    return nullptr;
#endif
}